

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

string * __thiscall
pfederc::LoopExpr::toString_abi_cxx11_(string *__return_storage_ptr__,LoopExpr *this)

{
  Expr *pEVar1;
  char cVar2;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = (char)__return_storage_ptr__;
  if ((this->super_Expr).type == EXPR_LOOP_DO) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((this->initExpr)._M_t.
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl == (Expr *)0x0)
    goto LAB_0011af12;
    std::__cxx11::string::push_back(cVar2);
    (*((this->initExpr)._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&sStack_38);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pEVar1 = (this->initExpr)._M_t.
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
             super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[2])(&sStack_38);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_38);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    (*((this->condExpr)._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&sStack_38);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    if ((this->itExpr)._M_t.
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl == (Expr *)0x0)
    goto LAB_0011af12;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*((this->itExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
       ._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&sStack_38);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
LAB_0011af12:
  std::__cxx11::string::push_back(cVar2);
  BodyExpr::toString_abi_cxx11_
            (&sStack_38,
             (this->bodyExpr)._M_t.
             super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
             super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::string::push_back(cVar2);
  if ((this->super_Expr).type == EXPR_LOOP_DO) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*((this->condExpr)._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&sStack_38);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_38);
    if ((this->itExpr)._M_t.
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*((this->itExpr)._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&sStack_38);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LoopExpr::toString() const noexcept {
  std::string result;
  if (getType() == ExprType::EXPR_LOOP_DO) {
    result += "do";
    if (initExpr) {
      result += ' ';
      result += initExpr->toString();
    }
  } else {
    result += "for ";
    if (initExpr) {
      result += initExpr->toString();
      result += "; ";
    }
    result += condExpr->toString();
    if (itExpr) {
      result += "; ";
      result += itExpr->toString();
    }
  }

  result += '\n';
  result += bodyExpr->toString();
  result += ';';

  if (getType() == ExprType::EXPR_LOOP_DO) {
    result += " for ";
    result += condExpr->toString();
    if (itExpr) {
      result += "; ";
      result += itExpr->toString();
    }
  }

  return result;
}